

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnBr(TypeChecker *this,Index depth)

{
  Result RVar1;
  Result RVar2;
  Enum EVar3;
  TypeVector *sig;
  Label *local_20;
  Label *label;
  
  RVar1 = GetLabel(this,depth,&local_20);
  if (RVar1.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    sig = &local_20->result_types;
    if (local_20->label_type == Loop) {
      sig = &local_20->param_types;
    }
    RVar1 = CheckSignature(this,sig,"br");
    RVar2 = SetUnreachable(this);
    EVar3 = (Enum)(RVar2.enum_ == Error || RVar1.enum_ == Error);
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::OnBr(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  result |= CheckSignature(label->br_types(), "br");
  CHECK_RESULT(SetUnreachable());
  return result;
}